

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::rl_dhl(SM83 *this)

{
  byte bVar1;
  bool bVar2;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&>
  fmt;
  unsigned_short *in_stack_ffffffffffffffc8;
  u8 result;
  bool should_carry;
  bool carry;
  u8 value;
  SM83 *this_local;
  
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x45;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  RL (HL)\n",fmt,
             &(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,in_stack_ffffffffffffffc8);
  bVar1 = Bus::Read8(this->bus,(this->field_3).hl,true);
  bVar2 = HasFlag(this,Carry);
  SetCarryFlag(this,(bVar1 & 0x80) != 0);
  bVar1 = bVar1 << 1 | bVar2;
  SetZeroFlag(this,bVar1 == 0);
  SetNegateFlag(this,false);
  SetHalfCarryFlag(this,false);
  Bus::Write8(this->bus,(this->field_3).hl,bVar1,true);
  return;
}

Assistant:

void SM83::rl_dhl() {
    LTRACE("RL (HL)");

    u8 value = bus.Read8(hl);
    bool carry = HasFlag(Flags::Carry);

    bool should_carry = value & (1 << 7);
    SetCarryFlag(should_carry);

    u8 result = value << 1;
    result |= carry;

    SetZeroFlag(result == 0);
    SetNegateFlag(false);
    SetHalfCarryFlag(false);

    bus.Write8(hl, result);
}